

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxleastsqsc.hpp
# Opt level: O2

void __thiscall
soplex::
SPxLeastSqSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::scale(SPxLeastSqSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *lp,bool persistent)

{
  shared_ptr<soplex::Tolerances> *psVar1;
  undefined1 uVar2;
  uint pmax;
  Real RVar3;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar4;
  SPxLeastSqSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  type_conflict5 tVar6;
  int iVar7;
  SPxOut *pSVar8;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar9;
  uint uVar10;
  char *t;
  cpp_dec_float<50U,_int,_void> *this_00;
  DataArray<int> *pDVar11;
  long lVar12;
  ulong uVar13;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar14;
  ulong uVar15;
  uint uVar16;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  double local_14d0;
  cpp_dec_float<50U,_int,_void> local_14c8;
  DataArray<int> *local_1490;
  undefined1 local_1488 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1480;
  pointer local_1478;
  uint auStack_1470 [2];
  uint local_1468 [2];
  int local_1460;
  bool local_145c;
  fpclass_type local_1458;
  int32_t iStack_1454;
  cpp_dec_float<50U,_int,_void> local_1448;
  double local_1410;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *rsccurr;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *csccurr;
  Verbosity old_verbosity_2;
  uint uStack_13f4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_13f0;
  pointer local_13e8;
  uint uStack_13e0;
  undefined3 uStack_13db;
  uint local_13d8;
  undefined3 uStack_13d3;
  int local_13d0;
  bool local_13cc;
  undefined8 local_13c8;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_13b8;
  SPxLeastSqSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_13b0;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *rscprev;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *cscprev;
  Verbosity old_verbosity;
  uint uStack_1394;
  uint auStack_1390 [2];
  uint local_1388 [2];
  uint auStack_1380 [2];
  uint local_1378 [2];
  int local_1370;
  bool local_136c;
  fpclass_type local_1368;
  int32_t iStack_1364;
  uint local_1360 [2];
  uint auStack_1358 [2];
  uint local_1350 [2];
  uint auStack_1348 [2];
  uint local_1340 [2];
  int local_1338;
  bool local_1334;
  fpclass_type local_1330;
  int32_t iStack_132c;
  cpp_dec_float<50U,_int,_void> local_1328;
  DataArray<int> *local_12e8;
  undefined8 uStack_12e0;
  int dummy2;
  int dummy1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_1288;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_1278;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_1268;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_1258;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_1248;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_1238;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_1228;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_1218;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_1208;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_11f8;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_11e8;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_11d8;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  resncols;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1178;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1138;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_10f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_10b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1078;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1038;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_ff8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_fb8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_f78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_f38;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_ef8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_eb8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e38;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_df8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_db8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d38;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  tmpcols;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  resnrows;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  colnnzinv;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  rownnzinv;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  tmprows;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  rowlogs;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  rowscale1;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  facnrows;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  collogs;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  smax;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_9d8;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_988;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_938;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_8e8;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_898;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  rowscale2;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  colscale2;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  colscale1;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  facncols;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_6f0;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_688;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_620;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_5d0;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_580;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_530;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_470;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_438;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_400;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_390;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_358;
  cpp_dec_float<50U,_int,_void> local_320;
  cpp_dec_float<50U,_int,_void> local_2e8;
  cpp_dec_float<50U,_int,_void> local_2b0;
  cpp_dec_float<50U,_int,_void> local_278;
  cpp_dec_float<50U,_int,_void> local_240;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_208;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_198;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_160;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_128;
  cpp_dec_float<50U,_int,_void> local_d8;
  cpp_dec_float<50U,_int,_void> local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  pSVar8 = (this->
           super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).spxout;
  if ((pSVar8 != (SPxOut *)0x0) && (2 < (int)pSVar8->m_verbosity)) {
    old_verbosity = pSVar8->m_verbosity;
    facnrows.
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray._0_4_ = 3;
    (*pSVar8->_vptr_SPxOut[2])();
    pSVar8 = soplex::operator<<((this->
                                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).spxout,"Least squares LP scaling");
    t = "";
    if (persistent) {
      t = " (persistent)";
    }
    pSVar8 = soplex::operator<<(pSVar8,t);
    std::endl<char,std::char_traits<char>>(pSVar8->m_streams[pSVar8->m_verbosity]);
    pSVar8 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    (*pSVar8->_vptr_SPxOut[2])(pSVar8,&old_verbosity);
  }
  (**(this->
     super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
     )._vptr_SPxScaler)(this,lp);
  uVar16 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
  pmax = (lp->
         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).
         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         .set.thenum;
  iVar7 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::nNzos(lp);
  if (iVar7 == 0) {
    (*(this->
      super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      )._vptr_SPxScaler[2])(this,lp);
    return;
  }
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SVSetBase(&facnrows,uVar16,uVar16,1.1,1.2);
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SVSetBase(&facncols,pmax,pmax,1.1,1.2);
  psVar1 = &(this->
            super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances;
  local_13b8 = lp;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_11d8,&psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
            );
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(&colscale1,pmax,(shared_ptr<soplex::Tolerances> *)&local_11d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_11d8._M_refcount);
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_11e8,&psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
            );
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(&colscale2,pmax,(shared_ptr<soplex::Tolerances> *)&local_11e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_11e8._M_refcount);
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_11f8,&psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
            );
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(&rowscale1,uVar16,(shared_ptr<soplex::Tolerances> *)&local_11f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_11f8._M_refcount);
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1208,&psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
            );
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(&rowscale2,uVar16,(shared_ptr<soplex::Tolerances> *)&local_1208);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1208._M_refcount);
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1218,&psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
            );
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(&resnrows,uVar16,(shared_ptr<soplex::Tolerances> *)&local_1218);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1218._M_refcount);
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1228,&psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
            );
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(&resncols,pmax,(shared_ptr<soplex::Tolerances> *)&local_1228);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1228._M_refcount);
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1238,&psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
            );
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(&tmprows,uVar16,(shared_ptr<soplex::Tolerances> *)&local_1238);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1238._M_refcount);
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1248,&psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
            );
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(&tmpcols,pmax,(shared_ptr<soplex::Tolerances> *)&local_1248);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1248._M_refcount);
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1258,&psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
            );
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(&rowlogs,uVar16,(shared_ptr<soplex::Tolerances> *)&local_1258);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1258._M_refcount);
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1268,&psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
            );
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(&collogs,pmax,(shared_ptr<soplex::Tolerances> *)&local_1268);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1268._M_refcount);
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1278,&psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
            );
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(&rownnzinv,uVar16,(shared_ptr<soplex::Tolerances> *)&local_1278);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1278._M_refcount);
  local_1490 = (DataArray<int> *)psVar1;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1288,&psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
            );
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SSVectorBase(&colnnzinv,pmax,(shared_ptr<soplex::Tolerances> *)&local_1288);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1288._M_refcount);
  pSVar4 = local_13b8;
  pDVar11 = local_1490;
  csccurr = &colscale1;
  cscprev = &colscale2;
  rsccurr = &rowscale1;
  pSVar8 = (this->
           super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).spxout;
  rscprev = &rowscale2;
  if ((pSVar8 != (SPxOut *)0x0) && (3 < (int)pSVar8->m_verbosity)) {
    old_verbosity = pSVar8->m_verbosity;
    smax.m_backend.data._M_elems[0] = 4;
    (*pSVar8->_vptr_SPxOut[2])();
    pSVar8 = soplex::operator<<((this->
                                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).spxout,"before scaling:");
    pSVar8 = soplex::operator<<(pSVar8," min= ");
    (*(pSVar4->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[3])(&local_160,pSVar4,1);
    pSVar8 = soplex::operator<<(pSVar8,&local_160);
    pSVar8 = soplex::operator<<(pSVar8," max= ");
    (*(pSVar4->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[4])(&local_198,pSVar4,1);
    pSVar8 = soplex::operator<<(pSVar8,&local_198);
    pSVar8 = soplex::operator<<(pSVar8," col-ratio= ");
    (*(this->
      super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      )._vptr_SPxScaler[0x33])(&local_1d0,this,pSVar4);
    pSVar8 = soplex::operator<<(pSVar8,&local_1d0);
    pSVar8 = soplex::operator<<(pSVar8," row-ratio= ");
    (*(this->
      super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      )._vptr_SPxScaler[0x34])(&local_208,this,pSVar4);
    pSVar8 = soplex::operator<<(pSVar8,&local_208);
    std::endl<char,std::char_traits<char>>(pSVar8->m_streams[pSVar8->m_verbosity]);
    pSVar8 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    (*pSVar8->_vptr_SPxOut[2])(pSVar8,&old_verbosity);
  }
  smax.m_backend.fpclass = cpp_dec_float_finite;
  smax.m_backend.prec_elem = 10;
  smax.m_backend.data._M_elems[0] = 0;
  smax.m_backend.data._M_elems[1] = 0;
  smax.m_backend.data._M_elems[2] = 0;
  smax.m_backend.data._M_elems[3] = 0;
  smax.m_backend.data._M_elems[4] = 0;
  smax.m_backend.data._M_elems[5] = 0;
  smax.m_backend.data._M_elems._24_5_ = 0;
  smax.m_backend.data._M_elems[7]._1_3_ = 0;
  smax.m_backend.data._M_elems._32_5_ = 0;
  smax.m_backend._37_8_ = 0;
  _old_verbosity = (long)iVar7;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
            (&smax.m_backend,(longlong *)&old_verbosity,&(this->acrcydivisor).m_backend);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_14c8,1.0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_1448,0.0,(type *)0x0);
  std::
  array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_3UL>
  ::array((array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_3UL>
           *)&old_verbosity);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<50U,_int,_void> *)local_1488,0.0,(type *)0x0);
  std::
  array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_3UL>
  ::fill((array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_3UL>
          *)&old_verbosity,(value_type *)local_1488);
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_1488,
             (__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)pDVar11);
  RVar3 = Tolerances::epsilon((Tolerances *)local_1488);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_240,RVar3,(type *)0x0);
  initConstVecs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)pSVar4,&facnrows,&rowlogs,&rownnzinv,
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_240);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1480);
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_1488,
             (__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)pDVar11);
  RVar3 = Tolerances::epsilon((Tolerances *)local_1488);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_278,RVar3,(type *)0x0);
  initConstVecs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&(pSVar4->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ,&facncols,&collogs,&colnnzinv,
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_278);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1480);
  dummy1 = 0;
  dummy2 = 0;
  pSVar9 = SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
           ::
           assign2product4setup<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       *)&tmpcols,&facnrows,&rowlogs,(Timer *)0x0,(Timer *)0x0,&dummy1,&dummy2);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator-((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)local_1488,
              &collogs.
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,&pSVar9->
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             );
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator=((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
               *)&resncols,
              (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)local_1488);
  std::
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  ::~_Vector_base((_Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   *)local_1488);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup(&resncols);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup(&resnrows);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::
  assignPWproduct4setup<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              *)&rowscale1,&rownnzinv,&rowlogs);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(&rowscale2,&rowscale1);
  pSVar9 = SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
           ::
           assignPWproduct4setup<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       *)&tmpcols,&colnnzinv,&resncols);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::operator*((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)local_1488,
              (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
               *)&resncols,pSVar9);
  local_13b0 = this;
  for (uVar10 = 0; pSVar5 = local_13b0, (int)uVar10 < local_13b0->maxrounds; uVar10 = uVar10 + 1) {
    _local_13d8 = local_1468._0_5_;
    uStack_13d3 = local_1468[1]._1_3_;
    local_13e8 = local_1478;
    _uStack_13e0 = auStack_1470._0_5_;
    uStack_13db = auStack_1470[1]._1_3_;
    _old_verbosity_2 = (Tolerances *)local_1488;
    _Stack_13f0._M_pi = _Stack_1480._M_pi;
    local_13d0 = local_1460;
    local_13cc = local_145c;
    local_13c8._0_4_ = local_1458;
    local_13c8._4_4_ = iStack_1454;
    tVar6 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_1488,&smax);
    if (tVar6) break;
    if ((uVar10 & 1) == 0) {
      if (uVar10 != 0) {
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::SSVectorBase(&local_898,&rownnzinv);
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::SSVectorBase(&local_8e8,&resnrows);
        local_d38.m_backend.data._M_elems[8] = local_14c8.data._M_elems[8];
        local_d38.m_backend.data._M_elems[9] = local_14c8.data._M_elems[9];
        local_d38.m_backend.data._M_elems[4] = local_14c8.data._M_elems[4];
        local_d38.m_backend.data._M_elems[5] = local_14c8.data._M_elems[5];
        local_d38.m_backend.data._M_elems[6] = local_14c8.data._M_elems[6];
        local_d38.m_backend.data._M_elems[7] = local_14c8.data._M_elems[7];
        local_d38.m_backend.data._M_elems[0] = local_14c8.data._M_elems[0];
        local_d38.m_backend.data._M_elems[1] = local_14c8.data._M_elems[1];
        local_d38.m_backend.data._M_elems[2] = local_14c8.data._M_elems[2];
        local_d38.m_backend.data._M_elems[3] = local_14c8.data._M_elems[3];
        local_d38.m_backend.exp = local_14c8.exp;
        local_d38.m_backend.neg = local_14c8.neg;
        local_d38.m_backend.fpclass = local_14c8.fpclass;
        local_d38.m_backend.prec_elem = local_14c8.prec_elem;
        local_d78.m_backend.data._M_elems[0] = local_1448.data._M_elems[0];
        local_d78.m_backend.data._M_elems[1] = local_1448.data._M_elems[1];
        local_d78.m_backend.data._M_elems[2] = local_1448.data._M_elems[2];
        local_d78.m_backend.data._M_elems[3] = local_1448.data._M_elems[3];
        local_d78.m_backend.data._M_elems[4] = local_1448.data._M_elems[4];
        local_d78.m_backend.data._M_elems[5] = local_1448.data._M_elems[5];
        local_d78.m_backend.data._M_elems[6] = local_1448.data._M_elems[6];
        local_d78.m_backend.data._M_elems[7] = local_1448.data._M_elems[7];
        local_d78.m_backend.data._M_elems[8] = local_1448.data._M_elems[8];
        local_d78.m_backend.data._M_elems[9] = local_1448.data._M_elems[9];
        local_d78.m_backend.exp = local_1448.exp;
        local_d78.m_backend.neg = local_1448.neg;
        local_d78.m_backend.fpclass = local_1448.fpclass;
        local_d78.m_backend.prec_elem = local_1448.prec_elem;
        local_db8.m_backend.data._M_elems[0] = local_1360[0];
        local_db8.m_backend.data._M_elems[1] = local_1360[1];
        local_db8.m_backend.data._M_elems[2] = auStack_1358[0];
        local_db8.m_backend.data._M_elems[3] = auStack_1358[1];
        local_db8.m_backend.data._M_elems[4] = local_1350[0];
        local_db8.m_backend.data._M_elems[5] = local_1350[1];
        local_db8.m_backend.data._M_elems[6] = auStack_1348[0];
        local_db8.m_backend.data._M_elems[7] = auStack_1348[1];
        local_db8.m_backend.data._M_elems[8] = local_1340[0];
        local_db8.m_backend.data._M_elems[9] = local_1340[1];
        local_db8.m_backend.exp = local_1338;
        local_db8.m_backend.neg = local_1334;
        local_db8.m_backend.fpclass = local_1330;
        local_db8.m_backend.prec_elem = iStack_132c;
        local_df8.m_backend.data._M_elems[8] = local_1328.data._M_elems[8];
        local_df8.m_backend.data._M_elems[9] = local_1328.data._M_elems[9];
        local_df8.m_backend.data._M_elems[4] = local_1328.data._M_elems[4];
        local_df8.m_backend.data._M_elems[5] = local_1328.data._M_elems[5];
        local_df8.m_backend.data._M_elems[6] = local_1328.data._M_elems[6];
        local_df8.m_backend.data._M_elems[7] = local_1328.data._M_elems[7];
        local_df8.m_backend.data._M_elems[0] = local_1328.data._M_elems[0];
        local_df8.m_backend.data._M_elems[1] = local_1328.data._M_elems[1];
        local_df8.m_backend.data._M_elems[2] = local_1328.data._M_elems[2];
        local_df8.m_backend.data._M_elems[3] = local_1328.data._M_elems[3];
        local_df8.m_backend.exp = local_1328.exp;
        local_df8.m_backend.neg = local_1328.neg;
        local_df8.m_backend.fpclass = local_1328.fpclass;
        local_df8.m_backend.prec_elem = local_1328.prec_elem;
        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&result_2,
                   (__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)pDVar11);
        RVar3 = Tolerances::epsilon((Tolerances *)result_2.m_backend.data._M_elems._0_8_);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&local_2b0,RVar3,(type *)0x0);
        updateScale<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_898,&local_8e8,&tmprows,&rsccurr,&rscprev,&local_d38,&local_d78,&local_db8
                   ,&local_df8,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_2b0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   (result_2.m_backend.data._M_elems + 2));
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::~SSVectorBase(&local_8e8);
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::~SSVectorBase(&local_898);
      }
      SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::SVSetBase(&local_688,&facncols);
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::SSVectorBase(&local_128,&resncols);
      local_e38.m_backend.data._M_elems[8] = local_1378[0];
      local_e38.m_backend.data._M_elems[9] = local_1378[1];
      local_e38.m_backend.data._M_elems[4] = local_1388[0];
      local_e38.m_backend.data._M_elems[5] = local_1388[1];
      local_e38.m_backend.data._M_elems[6] = auStack_1380[0];
      local_e38.m_backend.data._M_elems[7] = auStack_1380[1];
      local_e38.m_backend.data._M_elems[0] = old_verbosity;
      local_e38.m_backend.data._M_elems[1] = uStack_1394;
      local_e38.m_backend.data._M_elems[2] = auStack_1390[0];
      local_e38.m_backend.data._M_elems[3] = auStack_1390[1];
      local_e38.m_backend.exp = local_1370;
      local_e38.m_backend.neg = local_136c;
      local_e38.m_backend.fpclass = local_1368;
      local_e38.m_backend.prec_elem = iStack_1364;
      local_e78.m_backend.data._M_elems[0] = local_14c8.data._M_elems[0];
      local_e78.m_backend.data._M_elems[1] = local_14c8.data._M_elems[1];
      local_e78.m_backend.data._M_elems[2] = local_14c8.data._M_elems[2];
      local_e78.m_backend.data._M_elems[3] = local_14c8.data._M_elems[3];
      local_e78.m_backend.data._M_elems[4] = local_14c8.data._M_elems[4];
      local_e78.m_backend.data._M_elems[5] = local_14c8.data._M_elems[5];
      local_e78.m_backend.data._M_elems[6] = local_14c8.data._M_elems[6];
      local_e78.m_backend.data._M_elems[7] = local_14c8.data._M_elems[7];
      local_e78.m_backend.data._M_elems[8] = local_14c8.data._M_elems[8];
      local_e78.m_backend.data._M_elems[9] = local_14c8.data._M_elems[9];
      local_e78.m_backend.exp = local_14c8.exp;
      local_e78.m_backend.neg = local_14c8.neg;
      local_e78.m_backend.fpclass = local_14c8.fpclass;
      local_e78.m_backend.prec_elem = local_14c8.prec_elem;
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&result_2,
                 (__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)pDVar11);
      RVar3 = Tolerances::epsilon((Tolerances *)result_2.m_backend.data._M_elems._0_8_);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&local_68,RVar3,(type *)0x0);
      updateRes<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_688,&local_128,&resnrows,&tmprows,&local_e38,&local_e78,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_68);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 (result_2.m_backend.data._M_elems + 2));
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::~SSVectorBase(&local_128);
      SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::~SVSetBase(&local_688);
      pSVar9 = SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
               ::
               assignPWproduct4setup<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           *)&tmprows,&resnrows,&rownnzinv);
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
      ::operator*(&result_2,
                  (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                   *)&resnrows,pSVar9);
    }
    else {
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::SSVectorBase(&local_938,&colnnzinv);
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::SSVectorBase(&local_988,&resncols);
      local_eb8.m_backend.data._M_elems[8] = local_14c8.data._M_elems[8];
      local_eb8.m_backend.data._M_elems[9] = local_14c8.data._M_elems[9];
      local_eb8.m_backend.data._M_elems[4] = local_14c8.data._M_elems[4];
      local_eb8.m_backend.data._M_elems[5] = local_14c8.data._M_elems[5];
      local_eb8.m_backend.data._M_elems[6] = local_14c8.data._M_elems[6];
      local_eb8.m_backend.data._M_elems[7] = local_14c8.data._M_elems[7];
      local_eb8.m_backend.data._M_elems[0] = local_14c8.data._M_elems[0];
      local_eb8.m_backend.data._M_elems[1] = local_14c8.data._M_elems[1];
      local_eb8.m_backend.data._M_elems[2] = local_14c8.data._M_elems[2];
      local_eb8.m_backend.data._M_elems[3] = local_14c8.data._M_elems[3];
      local_eb8.m_backend.exp = local_14c8.exp;
      local_eb8.m_backend.neg = local_14c8.neg;
      local_eb8.m_backend.fpclass = local_14c8.fpclass;
      local_eb8.m_backend.prec_elem = local_14c8.prec_elem;
      local_ef8.m_backend.data._M_elems[0] = local_1448.data._M_elems[0];
      local_ef8.m_backend.data._M_elems[1] = local_1448.data._M_elems[1];
      local_ef8.m_backend.data._M_elems[2] = local_1448.data._M_elems[2];
      local_ef8.m_backend.data._M_elems[3] = local_1448.data._M_elems[3];
      local_ef8.m_backend.data._M_elems[4] = local_1448.data._M_elems[4];
      local_ef8.m_backend.data._M_elems[5] = local_1448.data._M_elems[5];
      local_ef8.m_backend.data._M_elems[6] = local_1448.data._M_elems[6];
      local_ef8.m_backend.data._M_elems[7] = local_1448.data._M_elems[7];
      local_ef8.m_backend.data._M_elems[8] = local_1448.data._M_elems[8];
      local_ef8.m_backend.data._M_elems[9] = local_1448.data._M_elems[9];
      local_ef8.m_backend.exp = local_1448.exp;
      local_ef8.m_backend.neg = local_1448.neg;
      local_ef8.m_backend.fpclass = local_1448.fpclass;
      local_ef8.m_backend.prec_elem = local_1448.prec_elem;
      local_f38.m_backend.data._M_elems[0] = local_1360[0];
      local_f38.m_backend.data._M_elems[1] = local_1360[1];
      local_f38.m_backend.data._M_elems[2] = auStack_1358[0];
      local_f38.m_backend.data._M_elems[3] = auStack_1358[1];
      local_f38.m_backend.data._M_elems[4] = local_1350[0];
      local_f38.m_backend.data._M_elems[5] = local_1350[1];
      local_f38.m_backend.data._M_elems[6] = auStack_1348[0];
      local_f38.m_backend.data._M_elems[7] = auStack_1348[1];
      local_f38.m_backend.data._M_elems[8] = local_1340[0];
      local_f38.m_backend.data._M_elems[9] = local_1340[1];
      local_f38.m_backend.exp = local_1338;
      local_f38.m_backend.neg = local_1334;
      local_f38.m_backend.fpclass = local_1330;
      local_f38.m_backend.prec_elem = iStack_132c;
      local_f78.m_backend.data._M_elems[8] = local_1328.data._M_elems[8];
      local_f78.m_backend.data._M_elems[9] = local_1328.data._M_elems[9];
      local_f78.m_backend.data._M_elems[4] = local_1328.data._M_elems[4];
      local_f78.m_backend.data._M_elems[5] = local_1328.data._M_elems[5];
      local_f78.m_backend.data._M_elems[6] = local_1328.data._M_elems[6];
      local_f78.m_backend.data._M_elems[7] = local_1328.data._M_elems[7];
      local_f78.m_backend.data._M_elems[0] = local_1328.data._M_elems[0];
      local_f78.m_backend.data._M_elems[1] = local_1328.data._M_elems[1];
      local_f78.m_backend.data._M_elems[2] = local_1328.data._M_elems[2];
      local_f78.m_backend.data._M_elems[3] = local_1328.data._M_elems[3];
      local_f78.m_backend.exp = local_1328.exp;
      local_f78.m_backend.neg = local_1328.neg;
      local_f78.m_backend.fpclass = local_1328.fpclass;
      local_f78.m_backend.prec_elem = local_1328.prec_elem;
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&result_2,
                 (__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)pDVar11);
      RVar3 = Tolerances::epsilon((Tolerances *)result_2.m_backend.data._M_elems._0_8_);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&local_2e8,RVar3,(type *)0x0);
      updateScale<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_938,&local_988,&tmpcols,&csccurr,&cscprev,&local_eb8,&local_ef8,&local_f38,
                 &local_f78,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_2e8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 (result_2.m_backend.data._M_elems + 2));
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::~SSVectorBase(&local_988);
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::~SSVectorBase(&local_938);
      SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::SVSetBase(&local_6f0,&facnrows);
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::SSVectorBase(&local_9d8,&resnrows);
      local_fb8.m_backend.data._M_elems[8] = local_1378[0];
      local_fb8.m_backend.data._M_elems[9] = local_1378[1];
      local_fb8.m_backend.data._M_elems[4] = local_1388[0];
      local_fb8.m_backend.data._M_elems[5] = local_1388[1];
      local_fb8.m_backend.data._M_elems[6] = auStack_1380[0];
      local_fb8.m_backend.data._M_elems[7] = auStack_1380[1];
      local_fb8.m_backend.data._M_elems[0] = old_verbosity;
      local_fb8.m_backend.data._M_elems[1] = uStack_1394;
      local_fb8.m_backend.data._M_elems[2] = auStack_1390[0];
      local_fb8.m_backend.data._M_elems[3] = auStack_1390[1];
      local_fb8.m_backend.exp = local_1370;
      local_fb8.m_backend.neg = local_136c;
      local_fb8.m_backend.fpclass = local_1368;
      local_fb8.m_backend.prec_elem = iStack_1364;
      local_ff8.m_backend.data._M_elems[0] = local_14c8.data._M_elems[0];
      local_ff8.m_backend.data._M_elems[1] = local_14c8.data._M_elems[1];
      local_ff8.m_backend.data._M_elems[2] = local_14c8.data._M_elems[2];
      local_ff8.m_backend.data._M_elems[3] = local_14c8.data._M_elems[3];
      local_ff8.m_backend.data._M_elems[4] = local_14c8.data._M_elems[4];
      local_ff8.m_backend.data._M_elems[5] = local_14c8.data._M_elems[5];
      local_ff8.m_backend.data._M_elems[6] = local_14c8.data._M_elems[6];
      local_ff8.m_backend.data._M_elems[7] = local_14c8.data._M_elems[7];
      local_ff8.m_backend.data._M_elems[8] = local_14c8.data._M_elems[8];
      local_ff8.m_backend.data._M_elems[9] = local_14c8.data._M_elems[9];
      local_ff8.m_backend.exp = local_14c8.exp;
      local_ff8.m_backend.neg = local_14c8.neg;
      local_ff8.m_backend.fpclass = local_14c8.fpclass;
      local_ff8.m_backend.prec_elem = local_14c8.prec_elem;
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&result_2,
                 (__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)pDVar11);
      RVar3 = Tolerances::epsilon((Tolerances *)result_2.m_backend.data._M_elems._0_8_);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&local_320,RVar3,(type *)0x0);
      updateRes<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_6f0,&local_9d8,&resncols,&tmpcols,&local_fb8,&local_ff8,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_320);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 (result_2.m_backend.data._M_elems + 2));
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::~SSVectorBase(&local_9d8);
      SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::~SVSetBase(&local_6f0);
      pSVar9 = SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
               ::
               assignPWproduct4setup<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                           *)&tmpcols,&resncols,&colnnzinv);
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
      ::operator*(&result_2,
                  (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                   *)&resncols,pSVar9);
    }
    local_1468[1]._1_3_ = result_2.m_backend.data._M_elems[9]._1_3_;
    local_1468._0_5_ = result_2.m_backend.data._M_elems._32_5_;
    auStack_1470[1]._1_3_ = result_2.m_backend.data._M_elems[7]._1_3_;
    auStack_1470._0_5_ = result_2.m_backend.data._M_elems._24_5_;
    local_1478 = (pointer)result_2.m_backend.data._M_elems._16_8_;
    local_1488._0_4_ = result_2.m_backend.data._M_elems[0];
    local_1488._4_4_ = result_2.m_backend.data._M_elems[1];
    _Stack_1480._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)result_2.m_backend.data._M_elems._8_8_;
    local_1460 = result_2.m_backend.exp;
    local_145c = result_2.m_backend.neg;
    local_1458 = result_2.m_backend.fpclass;
    iStack_1454 = result_2.m_backend.prec_elem;
    this_00 = &local_1328;
    for (lVar12 = -2; lVar12 != 0; lVar12 = lVar12 + 1) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (this_00,this_00 + -1);
      this_00 = this_00 + -1;
    }
    result_1.m_backend.fpclass = cpp_dec_float_finite;
    result_1.m_backend.prec_elem = 10;
    result_1.m_backend.data._M_elems[0] = 0;
    result_1.m_backend.data._M_elems[1] = 0;
    result_1.m_backend.data._M_elems[2] = 0;
    result_1.m_backend.data._M_elems[3] = 0;
    result_1.m_backend.data._M_elems[4] = 0;
    result_1.m_backend.data._M_elems[5] = 0;
    result_1.m_backend.data._M_elems._24_5_ = 0;
    result_1.m_backend.data._M_elems[7]._1_3_ = 0;
    result_1.m_backend.data._M_elems._32_5_ = 0;
    result_1.m_backend.data._M_elems[9]._1_3_ = 0;
    result_1.m_backend.exp = 0;
    result_1.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result_1.m_backend,&local_14c8,(cpp_dec_float<50U,_int,_void> *)local_1488);
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 10;
    result_2.m_backend.data._M_elems[0] = 0;
    result_2.m_backend.data._M_elems[1] = 0;
    result_2.m_backend.data._M_elems[2] = 0;
    result_2.m_backend.data._M_elems[3] = 0;
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems._24_5_ = 0;
    result_2.m_backend.data._M_elems[7]._1_3_ = 0;
    result_2.m_backend.data._M_elems._32_5_ = 0;
    result_2.m_backend.data._M_elems[9]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result_2.m_backend,&result_1.m_backend,
               (cpp_dec_float<50U,_int,_void> *)&old_verbosity_2);
    local_1378[1]._1_3_ = result_2.m_backend.data._M_elems[9]._1_3_;
    local_1378._0_5_ = result_2.m_backend.data._M_elems._32_5_;
    auStack_1380[1]._1_3_ = result_2.m_backend.data._M_elems[7]._1_3_;
    auStack_1380._0_5_ = result_2.m_backend.data._M_elems._24_5_;
    local_1388[0] = result_2.m_backend.data._M_elems[4];
    local_1388[1] = result_2.m_backend.data._M_elems[5];
    old_verbosity = result_2.m_backend.data._M_elems[0];
    uStack_1394 = result_2.m_backend.data._M_elems[1];
    auStack_1390[0] = result_2.m_backend.data._M_elems[2];
    auStack_1390[1] = result_2.m_backend.data._M_elems[3];
    local_1370 = result_2.m_backend.exp;
    local_136c = result_2.m_backend.neg;
    local_1368 = result_2.m_backend.fpclass;
    iStack_1364 = result_2.m_backend.prec_elem;
    result_1.m_backend.data._M_elems._32_5_ = local_14c8.data._M_elems._32_5_;
    result_1.m_backend.data._M_elems[9]._1_3_ = local_14c8.data._M_elems[9]._1_3_;
    result_1.m_backend.data._M_elems[4] = local_14c8.data._M_elems[4];
    result_1.m_backend.data._M_elems[5] = local_14c8.data._M_elems[5];
    result_1.m_backend.data._M_elems._24_5_ = local_14c8.data._M_elems._24_5_;
    result_1.m_backend.data._M_elems[7]._1_3_ = local_14c8.data._M_elems[7]._1_3_;
    result_1.m_backend.data._M_elems[0] = local_14c8.data._M_elems[0];
    result_1.m_backend.data._M_elems[1] = local_14c8.data._M_elems[1];
    result_1.m_backend.data._M_elems[2] = local_14c8.data._M_elems[2];
    result_1.m_backend.data._M_elems[3] = local_14c8.data._M_elems[3];
    iVar7 = local_14c8.exp;
    uVar2 = local_14c8.neg;
    local_12e8 = (DataArray<int> *)local_14c8._48_8_;
    uStack_12e0 = 0;
    local_14d0 = 1.0;
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 10;
    result_2.m_backend.data._M_elems[0] = 0;
    result_2.m_backend.data._M_elems[1] = 0;
    result_2.m_backend.data._M_elems[2] = 0;
    result_2.m_backend.data._M_elems[3] = 0;
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems._24_5_ = 0;
    result_2.m_backend.data._M_elems[7]._1_3_ = 0;
    result_2.m_backend.data._M_elems._32_5_ = 0;
    result_2.m_backend.data._M_elems[9]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
              (&result_2.m_backend,&local_14d0,(cpp_dec_float<50U,_int,_void> *)&old_verbosity);
    local_14c8.data._M_elems[9]._1_3_ = result_2.m_backend.data._M_elems[9]._1_3_;
    local_14c8.data._M_elems._32_5_ = result_2.m_backend.data._M_elems._32_5_;
    local_14c8.data._M_elems[0] = result_2.m_backend.data._M_elems[0];
    local_14c8.data._M_elems[1] = result_2.m_backend.data._M_elems[1];
    local_14c8.data._M_elems[2] = result_2.m_backend.data._M_elems[2];
    local_14c8.data._M_elems[3] = result_2.m_backend.data._M_elems[3];
    local_14c8.data._M_elems[4] = result_2.m_backend.data._M_elems[4];
    local_14c8.data._M_elems[5] = result_2.m_backend.data._M_elems[5];
    local_14c8.data._M_elems[7]._1_3_ = result_2.m_backend.data._M_elems[7]._1_3_;
    local_14c8.data._M_elems._24_5_ = result_2.m_backend.data._M_elems._24_5_;
    local_14c8.exp = result_2.m_backend.exp;
    local_14c8.neg = result_2.m_backend.neg;
    local_14c8.fpclass = result_2.m_backend.fpclass;
    local_14c8.prec_elem = result_2.m_backend.prec_elem;
    local_1448.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
    local_1448.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
    local_1448.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
    local_1448.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
    local_1448.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
    local_1448.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
    local_1448.data._M_elems[7]._1_3_ = result_1.m_backend.data._M_elems[7]._1_3_;
    local_1448.data._M_elems._24_5_ = result_1.m_backend.data._M_elems._24_5_;
    local_1448.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
    local_1448.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
    local_1448._48_8_ = local_12e8;
    pDVar11 = local_1490;
    local_1448.exp = iVar7;
    local_1448.neg = (bool)uVar2;
  }
  if ((uVar10 & 1) == 0 && uVar10 != 0) {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::SSVectorBase(&local_530,&colnnzinv);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::SSVectorBase(&local_580,&resncols);
    local_1038.m_backend.data._M_elems[8] = local_1448.data._M_elems[8];
    local_1038.m_backend.data._M_elems[9] = local_1448.data._M_elems[9];
    local_1038.m_backend.data._M_elems[4] = local_1448.data._M_elems[4];
    local_1038.m_backend.data._M_elems[5] = local_1448.data._M_elems[5];
    local_1038.m_backend.data._M_elems[6] = local_1448.data._M_elems[6];
    local_1038.m_backend.data._M_elems[7] = local_1448.data._M_elems[7];
    local_1038.m_backend.data._M_elems[0] = local_1448.data._M_elems[0];
    local_1038.m_backend.data._M_elems[1] = local_1448.data._M_elems[1];
    local_1038.m_backend.data._M_elems[2] = local_1448.data._M_elems[2];
    local_1038.m_backend.data._M_elems[3] = local_1448.data._M_elems[3];
    local_1038.m_backend.exp = local_1448.exp;
    local_1038.m_backend.neg = local_1448.neg;
    local_1038.m_backend.fpclass = local_1448.fpclass;
    local_1038.m_backend.prec_elem = local_1448.prec_elem;
    local_1078.m_backend.data._M_elems[0] = local_1360[0];
    local_1078.m_backend.data._M_elems[1] = local_1360[1];
    local_1078.m_backend.data._M_elems[2] = auStack_1358[0];
    local_1078.m_backend.data._M_elems[3] = auStack_1358[1];
    local_1078.m_backend.data._M_elems[4] = local_1350[0];
    local_1078.m_backend.data._M_elems[5] = local_1350[1];
    local_1078.m_backend.data._M_elems[6] = auStack_1348[0];
    local_1078.m_backend.data._M_elems[7] = auStack_1348[1];
    local_1078.m_backend.data._M_elems[8] = local_1340[0];
    local_1078.m_backend.data._M_elems[9] = local_1340[1];
    local_1078.m_backend.exp = local_1338;
    local_1078.m_backend.neg = local_1334;
    local_1078.m_backend.fpclass = local_1330;
    local_1078.m_backend.prec_elem = iStack_132c;
    local_10b8.m_backend.data._M_elems[8] = local_1328.data._M_elems[8];
    local_10b8.m_backend.data._M_elems[9] = local_1328.data._M_elems[9];
    local_10b8.m_backend.data._M_elems[4] = local_1328.data._M_elems[4];
    local_10b8.m_backend.data._M_elems[5] = local_1328.data._M_elems[5];
    local_10b8.m_backend.data._M_elems[6] = local_1328.data._M_elems[6];
    local_10b8.m_backend.data._M_elems[7] = local_1328.data._M_elems[7];
    local_10b8.m_backend.data._M_elems[0] = local_1328.data._M_elems[0];
    local_10b8.m_backend.data._M_elems[1] = local_1328.data._M_elems[1];
    local_10b8.m_backend.data._M_elems[2] = local_1328.data._M_elems[2];
    local_10b8.m_backend.data._M_elems[3] = local_1328.data._M_elems[3];
    local_10b8.m_backend.exp = local_1328.exp;
    local_10b8.m_backend.neg = local_1328.neg;
    local_10b8.m_backend.fpclass = local_1328.fpclass;
    local_10b8.m_backend.prec_elem = local_1328.prec_elem;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&old_verbosity_2,
               (__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)pDVar11);
    RVar3 = Tolerances::epsilon(_old_verbosity_2);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_a0,RVar3,(type *)0x0);
    pSVar9 = &local_530;
    pSVar14 = &local_580;
    updateScaleFinal<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (pSVar9,pSVar14,&tmpcols,&csccurr,&cscprev,&local_1038,&local_1078,&local_10b8,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_a0);
LAB_0028c25e:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_13f0);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~SSVectorBase(pSVar14);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~SSVectorBase(pSVar9);
  }
  else if (uVar10 != 0) {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::SSVectorBase(&local_5d0,&rownnzinv);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::SSVectorBase(&local_620,&resnrows);
    local_10f8.m_backend.data._M_elems[8] = local_1448.data._M_elems[8];
    local_10f8.m_backend.data._M_elems[9] = local_1448.data._M_elems[9];
    local_10f8.m_backend.data._M_elems[4] = local_1448.data._M_elems[4];
    local_10f8.m_backend.data._M_elems[5] = local_1448.data._M_elems[5];
    local_10f8.m_backend.data._M_elems[6] = local_1448.data._M_elems[6];
    local_10f8.m_backend.data._M_elems[7] = local_1448.data._M_elems[7];
    local_10f8.m_backend.data._M_elems[0] = local_1448.data._M_elems[0];
    local_10f8.m_backend.data._M_elems[1] = local_1448.data._M_elems[1];
    local_10f8.m_backend.data._M_elems[2] = local_1448.data._M_elems[2];
    local_10f8.m_backend.data._M_elems[3] = local_1448.data._M_elems[3];
    local_10f8.m_backend.exp = local_1448.exp;
    local_10f8.m_backend.neg = local_1448.neg;
    local_10f8.m_backend.fpclass = local_1448.fpclass;
    local_10f8.m_backend.prec_elem = local_1448.prec_elem;
    local_1138.m_backend.data._M_elems[0] = local_1360[0];
    local_1138.m_backend.data._M_elems[1] = local_1360[1];
    local_1138.m_backend.data._M_elems[2] = auStack_1358[0];
    local_1138.m_backend.data._M_elems[3] = auStack_1358[1];
    local_1138.m_backend.data._M_elems[4] = local_1350[0];
    local_1138.m_backend.data._M_elems[5] = local_1350[1];
    local_1138.m_backend.data._M_elems[6] = auStack_1348[0];
    local_1138.m_backend.data._M_elems[7] = auStack_1348[1];
    local_1138.m_backend.data._M_elems[8] = local_1340[0];
    local_1138.m_backend.data._M_elems[9] = local_1340[1];
    local_1138.m_backend.exp = local_1338;
    local_1138.m_backend.neg = local_1334;
    local_1138.m_backend.fpclass = local_1330;
    local_1138.m_backend.prec_elem = iStack_132c;
    local_1178.m_backend.data._M_elems[8] = local_1328.data._M_elems[8];
    local_1178.m_backend.data._M_elems[9] = local_1328.data._M_elems[9];
    local_1178.m_backend.data._M_elems[4] = local_1328.data._M_elems[4];
    local_1178.m_backend.data._M_elems[5] = local_1328.data._M_elems[5];
    local_1178.m_backend.data._M_elems[6] = local_1328.data._M_elems[6];
    local_1178.m_backend.data._M_elems[7] = local_1328.data._M_elems[7];
    local_1178.m_backend.data._M_elems[0] = local_1328.data._M_elems[0];
    local_1178.m_backend.data._M_elems[1] = local_1328.data._M_elems[1];
    local_1178.m_backend.data._M_elems[2] = local_1328.data._M_elems[2];
    local_1178.m_backend.data._M_elems[3] = local_1328.data._M_elems[3];
    local_1178.m_backend.exp = local_1328.exp;
    local_1178.m_backend.neg = local_1328.neg;
    local_1178.m_backend.fpclass = local_1328.fpclass;
    local_1178.m_backend.prec_elem = local_1328.prec_elem;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&old_verbosity_2,
               (__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)pDVar11);
    RVar3 = Tolerances::epsilon(_old_verbosity_2);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_d8,RVar3,(type *)0x0);
    pSVar9 = &local_5d0;
    pSVar14 = &local_620;
    updateScaleFinal<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (pSVar9,pSVar14,&tmprows,&rsccurr,&rscprev,&local_10f8,&local_1138,&local_1178,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_d8);
    goto LAB_0028c25e;
  }
  pSVar14 = csccurr;
  pSVar9 = rsccurr;
  local_1490 = (pSVar5->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_activeColscaleExp;
  local_12e8 = (pSVar5->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_activeRowscaleExp;
  uVar15 = 0;
  uVar13 = (ulong)uVar16;
  if ((int)uVar16 < 1) {
    uVar13 = uVar15;
  }
  for (; uVar13 != uVar15; uVar15 = uVar15 + 1) {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator[](&result_2,pSVar9,(int)uVar15);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator[](&result_1,pSVar9,(int)uVar15);
    local_1410 = 0.0;
    tVar6 = boost::multiprecision::operator>=(&result_1,&local_1410);
    uVar16 = 0x3fe00000;
    if (!tVar6) {
      uVar16 = 0xbfe00000;
    }
    local_14d0 = (double)((ulong)uVar16 << 0x20);
    local_13c8._0_4_ = cpp_dec_float_finite;
    local_13c8._4_4_ = 10;
    _old_verbosity_2 = (Tolerances *)0x0;
    _Stack_13f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_13e8 = (pointer)0x0;
    _uStack_13e0 = 0;
    uStack_13db = 0;
    _local_13d8 = 0;
    uStack_13d3 = 0;
    local_13d0 = 0;
    local_13cc = false;
    boost::multiprecision::default_ops::
    eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
              ((cpp_dec_float<50U,_int,_void> *)&old_verbosity_2,&result_2.m_backend,&local_14d0);
    iVar7 = boost::multiprecision::
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            ::convert_to<int>((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&old_verbosity_2);
    local_12e8->data[uVar15] = -iVar7;
  }
  uVar15 = 0;
  uVar13 = (ulong)pmax;
  if ((int)pmax < 1) {
    uVar13 = uVar15;
  }
  for (; pSVar5 = local_13b0, pSVar4 = local_13b8, uVar13 != uVar15; uVar15 = uVar15 + 1) {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator[](&result_2,pSVar14,(int)uVar15);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator[](&result_1,pSVar14,(int)uVar15);
    local_1410 = 0.0;
    tVar6 = boost::multiprecision::operator>=(&result_1,&local_1410);
    uVar16 = 0x3fe00000;
    if (!tVar6) {
      uVar16 = 0xbfe00000;
    }
    local_14d0 = (double)((ulong)uVar16 << 0x20);
    local_13c8._0_4_ = cpp_dec_float_finite;
    local_13c8._4_4_ = 10;
    _old_verbosity_2 = (Tolerances *)0x0;
    _Stack_13f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_13e8 = (pointer)0x0;
    _uStack_13e0 = 0;
    uStack_13db = 0;
    _local_13d8 = 0;
    uStack_13d3 = 0;
    local_13d0 = 0;
    local_13cc = false;
    boost::multiprecision::default_ops::
    eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
              ((cpp_dec_float<50U,_int,_void> *)&old_verbosity_2,&result_2.m_backend,&local_14d0);
    iVar7 = boost::multiprecision::
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            ::convert_to<int>((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&old_verbosity_2);
    local_1490->data[uVar15] = -iVar7;
  }
  (*(local_13b0->
    super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SPxScaler[2])(local_13b0,local_13b8);
  pSVar8 = (pSVar5->
           super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).spxout;
  if (pSVar8 != (SPxOut *)0x0) {
    if (4 < (int)pSVar8->m_verbosity) {
      _old_verbosity_2 = (Tolerances *)CONCAT44(uStack_13f4,pSVar8->m_verbosity);
      result_2.m_backend.data._M_elems[0] = 5;
      (*pSVar8->_vptr_SPxOut[2])();
      pSVar8 = soplex::operator<<((pSVar5->
                                  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).spxout,"Row scaling min= ");
      (*(pSVar5->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x31])(&local_358,pSVar5);
      pSVar8 = soplex::operator<<(pSVar8,&local_358);
      pSVar8 = soplex::operator<<(pSVar8," max= ");
      (*(pSVar5->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x32])(&local_390,pSVar5);
      pSVar8 = soplex::operator<<(pSVar8,&local_390);
      std::endl<char,std::char_traits<char>>(pSVar8->m_streams[pSVar8->m_verbosity]);
      pSVar8 = soplex::operator<<(pSVar8,"Col scaling min= ");
      (*(pSVar5->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x2f])(&local_3c8,pSVar5);
      pSVar8 = soplex::operator<<(pSVar8,&local_3c8);
      pSVar8 = soplex::operator<<(pSVar8," max= ");
      (*(pSVar5->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x30])(&local_400,pSVar5);
      pSVar8 = soplex::operator<<(pSVar8,&local_400);
      std::endl<char,std::char_traits<char>>(pSVar8->m_streams[pSVar8->m_verbosity]);
      pSVar8 = (pSVar5->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      (*pSVar8->_vptr_SPxOut[2])(pSVar8,&old_verbosity_2);
      pSVar8 = (pSVar5->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      if (pSVar8 == (SPxOut *)0x0) goto LAB_0028c6e8;
    }
    if (3 < (int)pSVar8->m_verbosity) {
      _old_verbosity_2 = (Tolerances *)CONCAT44(uStack_13f4,pSVar8->m_verbosity);
      result_2.m_backend.data._M_elems[0] = 4;
      (*pSVar8->_vptr_SPxOut[2])();
      pSVar8 = soplex::operator<<((pSVar5->
                                  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).spxout,"after scaling: ");
      pSVar8 = soplex::operator<<(pSVar8," min= ");
      (*(pSVar4->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[3])(&local_438,pSVar4,0);
      pSVar8 = soplex::operator<<(pSVar8,&local_438);
      pSVar8 = soplex::operator<<(pSVar8," max= ");
      (*(pSVar4->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[4])(&local_470,pSVar4,0);
      pSVar8 = soplex::operator<<(pSVar8,&local_470);
      pSVar8 = soplex::operator<<(pSVar8," col-ratio= ");
      (*(pSVar5->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x33])(&local_4a8,pSVar5,pSVar4);
      pSVar8 = soplex::operator<<(pSVar8,&local_4a8);
      pSVar8 = soplex::operator<<(pSVar8," row-ratio= ");
      (*(pSVar5->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x34])(&local_4e0,pSVar5,pSVar4);
      pSVar8 = soplex::operator<<(pSVar8,&local_4e0);
      std::endl<char,std::char_traits<char>>(pSVar8->m_streams[pSVar8->m_verbosity]);
      pSVar8 = (pSVar5->
               super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      (*pSVar8->_vptr_SPxOut[2])(pSVar8,&old_verbosity_2);
    }
  }
LAB_0028c6e8:
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~SSVectorBase(&colnnzinv);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~SSVectorBase(&rownnzinv);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~SSVectorBase(&collogs);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~SSVectorBase(&rowlogs);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~SSVectorBase(&tmpcols);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~SSVectorBase(&tmprows);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~SSVectorBase(&resncols);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~SSVectorBase(&resnrows);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~SSVectorBase(&rowscale2);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~SSVectorBase(&rowscale1);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~SSVectorBase(&colscale2);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~SSVectorBase(&colscale1);
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~SVSetBase(&facncols);
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~SVSetBase(&facnrows);
  return;
}

Assistant:

void SPxLeastSqSC<R>::scale(SPxLPBase<R>& lp,  bool persistent)
{
   SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Least squares LP scaling" <<
                 (persistent ? " (persistent)" : "") << std::endl;)

   this->setup(lp);

   const int nrows = lp.nRows();
   const int ncols = lp.nCols();
   const int lpnnz = lp.nNzos();

   // is contraints matrix empty?
   //todo don't create the scaler in this case!
   if(lpnnz == 0)
   {
      // to keep the invariants, we still need to call this method
      this->applyScaling(lp);

      return;
   }

   assert(nrows > 0 && ncols > 0 && lpnnz > 0);

   /* constant factor matrices;
    * in Curtis-Reid article
    * facnrows equals E^T M^(-1)
    * facncols equals E N^(-1)
    * */
   SVSetBase<R> facnrows(nrows, nrows, 1.1, 1.2);
   SVSetBase<R> facncols(ncols, ncols, 1.1, 1.2);

   /* column scaling factor vectors */
   SSVectorBase<R> colscale1(ncols, this->_tolerances);
   SSVectorBase<R> colscale2(ncols, this->_tolerances);

   /* row scaling factor vectors */
   SSVectorBase<R> rowscale1(nrows, this->_tolerances);
   SSVectorBase<R> rowscale2(nrows, this->_tolerances);

   /* residual vectors */
   SSVectorBase<R> resnrows(nrows, this->_tolerances);
   SSVectorBase<R> resncols(ncols, this->_tolerances);

   /* vectors to store temporary values */
   SSVectorBase<R> tmprows(nrows, this->_tolerances);
   SSVectorBase<R> tmpcols(ncols, this->_tolerances);

   /* vectors storing the row and column sums (respectively) of logarithms of
    *(absolute values of) non-zero elements of left hand matrix of LP
    */
   SSVectorBase<R> rowlogs(nrows, this->_tolerances);
   SSVectorBase<R> collogs(ncols, this->_tolerances);

   /* vectors storing the inverted number of non-zeros in each row and column
    *(respectively) of left hand matrix of LP
    */
   SSVectorBase<R> rownnzinv(nrows, this->_tolerances);
   SSVectorBase<R> colnnzinv(ncols, this->_tolerances);

   /* VectorBase<R> pointers */
   SSVectorBase<R>* csccurr = &colscale1;
   SSVectorBase<R>* cscprev = &colscale2;
   SSVectorBase<R>* rsccurr = &rowscale1;
   SSVectorBase<R>* rscprev = &rowscale2;

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "before scaling:"
                 << " min= " << lp.minAbsNzo()
                 << " max= " << lp.maxAbsNzo()
                 << " col-ratio= " << this->maxColRatio(lp)
                 << " row-ratio= " << this->maxRowRatio(lp)
                 << std::endl;)

   /* initialize scalars, vectors and matrices */

   assert(acrcydivisor > 0.0);

   const R smax = lpnnz / acrcydivisor;
   R qcurr = 1.0;
   R qprev = 0.0;

   std::array<R, 3> eprev;
   eprev.fill(0.0);

   initConstVecs(lp.rowSet(), facnrows, rowlogs, rownnzinv, R(this->tolerances()->epsilon()));
   initConstVecs(lp.colSet(), facncols, collogs, colnnzinv, R(this->tolerances()->epsilon()));

   assert(tmprows.isSetup() && tmpcols.isSetup());
   assert(rowscale1.isSetup() && rowscale2.isSetup());
   assert(colscale1.isSetup() && colscale2.isSetup());

   // compute first residual vector r0
   int dummy1 = 0;
   int dummy2 = 0;
   resncols = collogs - tmpcols.assign2product4setup(facnrows, rowlogs, nullptr, nullptr, dummy1,
              dummy2);

   resncols.setup();
   resnrows.setup();

   rowscale1.assignPWproduct4setup(rownnzinv, rowlogs);
   rowscale2 = rowscale1;

   R scurr = resncols * tmpcols.assignPWproduct4setup(colnnzinv, resncols);

   int k;

   /* conjugate gradient loop */
   for(k = 0; k < maxrounds; ++k)
   {
      const R sprev = scurr;

      // termination criterion met?
      if(scurr < smax)
         break;

      // is k even?
      if((k % 2) == 0)
      {
         // not in first iteration?
         if(k != 0)   // true, then update row scaling factor vector
            updateScale(rownnzinv, resnrows, tmprows, rsccurr, rscprev, qcurr, qprev, eprev[1], eprev[2],
                        R(this->tolerances()->epsilon()));

         updateRes(facncols, resncols, resnrows, tmprows, eprev[0], qcurr, R(this->tolerances()->epsilon()));
         scurr = resnrows * tmprows.assignPWproduct4setup(resnrows, rownnzinv);
      }
      else // k is odd
      {
         // update column scaling factor vector
         updateScale(colnnzinv, resncols, tmpcols, csccurr, cscprev, qcurr, qprev, eprev[1], eprev[2],
                     R(this->tolerances()->epsilon()));

         updateRes(facnrows, resnrows, resncols, tmpcols, eprev[0], qcurr, R(this->tolerances()->epsilon()));
         scurr = resncols * tmpcols.assignPWproduct4setup(resncols, colnnzinv);
      }

      // shift eprev entries one to the right
      for(unsigned l = 2; l > 0; --l)
         eprev[l] = eprev[l - 1];

      assert(isNotZero(sprev, R(this->tolerances()->epsilon())));

      eprev[0] = (qcurr * scurr) / sprev;

      const R tmp = qcurr;
      qcurr = 1.0 - eprev[0];
      qprev = tmp;
   }

   if(k > 0 && (k % 2) == 0)
   {
      // update column scaling factor vector
      updateScaleFinal(colnnzinv, resncols, tmpcols, csccurr, cscprev, qprev, eprev[1], eprev[2],
                       R(this->tolerances()->epsilon()));
   }
   else if(k > 0)
   {
      // update row scaling factor vector
      updateScaleFinal(rownnzinv, resnrows, tmprows, rsccurr, rscprev, qprev, eprev[1], eprev[2],
                       R(this->tolerances()->epsilon()));
   }

   /* compute actual scaling factors */

   const SSVectorBase<R>& rowscale = *rsccurr;
   const SSVectorBase<R>& colscale = *csccurr;

   DataArray<int>& colscaleExp = *this->m_activeColscaleExp;
   DataArray<int>& rowscaleExp = *this->m_activeRowscaleExp;

   for(k = 0; k < nrows; ++k)
      rowscaleExp[k] = -int(rowscale[k] + ((rowscale[k] >= 0.0) ? (+0.5) : (-0.5)));

   for(k = 0; k < ncols; ++k)
      colscaleExp[k] = -int(colscale[k] + ((colscale[k] >= 0.0) ? (+0.5) : (-0.5)));

   // scale
   this->applyScaling(lp);

   SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Row scaling min= " << this->minAbsRowscale()
                 << " max= " << this->maxAbsRowscale()
                 << std::endl
                 << "Col scaling min= " << this->minAbsColscale()
                 << " max= " << this->maxAbsColscale()
                 << std::endl;)

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "after scaling: "
                 << " min= " << lp.minAbsNzo(false)
                 << " max= " << lp.maxAbsNzo(false)
                 << " col-ratio= " << this->maxColRatio(lp)
                 << " row-ratio= " << this->maxRowRatio(lp)
                 << std::endl;)
}